

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

void __thiscall pfederc::ArrayCpyExpr::~ArrayCpyExpr(ArrayCpyExpr *this)

{
  Expr *pEVar1;
  
  pEVar1 = (this->lengthExpr)._M_t.
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (pEVar1 != (Expr *)0x0) {
    (*pEVar1->_vptr_Expr[1])();
  }
  (this->lengthExpr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  pEVar1 = (this->valueExpr)._M_t.
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (pEVar1 != (Expr *)0x0) {
    (*pEVar1->_vptr_Expr[1])();
  }
  (this->valueExpr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  operator_delete(this,0x48);
  return;
}

Assistant:

ArrayCpyExpr::~ArrayCpyExpr() {
}